

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

bool __thiscall soul::AST::FunctionCall::isResolved(FunctionCall *this)

{
  bool bVar1;
  int iVar2;
  Expression *pEVar3;
  
  bVar1 = CallOrCastBase::areAllArgumentsResolved(&this->super_CallOrCastBase);
  if (bVar1) {
    if ((this->targetFunction->returnType).object != (Expression *)0x0) {
      pEVar3 = pool_ptr<soul::AST::Expression>::operator->(&this->targetFunction->returnType);
      iVar2 = (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[3])(pEVar3);
      return SUB41(iVar2,0);
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isResolved() const override        { return areAllArgumentsResolved() && (targetFunction.returnType == nullptr || targetFunction.returnType->isResolved()); }